

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

bool __thiscall libcellml::ComponentEntity::doEquals(ComponentEntity *this,EntityPtr *other)

{
  EntityImpl *pEVar1;
  long lVar2;
  size_type sVar3;
  long lVar4;
  size_type sVar5;
  ComponentPtr *pCVar6;
  bool bVar7;
  __type _Var8;
  shared_ptr<libcellml::Component> *component;
  ComponentPtr *component_00;
  byte unaff_BPL;
  shared_ptr<libcellml::ComponentEntity> componentEntity;
  shared_ptr<libcellml::Entity> local_58;
  string local_48;
  
  bVar7 = NamedEntity::doEquals(&this->super_NamedEntity,other);
  if (bVar7) {
    std::dynamic_pointer_cast<libcellml::ComponentEntity,libcellml::Entity>(&local_58);
    bVar7 = true;
    if (local_58.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      encapsulationId_abi_cxx11_
                (&local_48,
                 (ComponentEntity *)
                 local_58.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &pEVar1[3].mId._M_string_length,&local_48);
      if (_Var8) {
        pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
        lVar2 = *(long *)((long)&pEVar1[2].mId.field_2 + 8);
        sVar3 = pEVar1[2].mId.field_2._M_allocated_capacity;
        lVar4 = *(long *)((long)&(local_58.
                                  super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->mPimpl[2].mId.field_2 + 8);
        sVar5 = (local_58.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->mPimpl[2].mId.field_2._M_allocated_capacity;
        std::__cxx11::string::~string((string *)&local_48);
        if (lVar2 - sVar3 == lVar4 - sVar5) {
          pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
          component_00 = (ComponentPtr *)pEVar1[2].mId.field_2._M_allocated_capacity;
          pCVar6 = *(ComponentPtr **)((long)&pEVar1[2].mId.field_2 + 8);
          do {
            unaff_BPL = component_00 == pCVar6;
            if ((bool)unaff_BPL) break;
            bVar7 = containsComponent((ComponentEntity *)
                                      local_58.
                                      super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,component_00,false);
            component_00 = component_00 + 1;
          } while (bVar7);
          bVar7 = false;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (!bVar7) goto LAB_001c8819;
  }
  unaff_BPL = 0;
LAB_001c8819:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ComponentEntity::doEquals(const EntityPtr &other) const
{
    if (NamedEntity::doEquals(other)) {
        auto componentEntity = std::dynamic_pointer_cast<ComponentEntity>(other);
        if ((componentEntity != nullptr)
            && pFunc()->mEncapsulationId == componentEntity->encapsulationId()
            && pFunc()->mComponents.size() == componentEntity->componentCount()) {
            for (const auto &component : pFunc()->mComponents) {
                if (!componentEntity->containsComponent(component, false)) {
                    return false;
                }
            }
            return true;
        }
    }

    return false;
}